

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_ssse3.c
# Opt level: O0

void idct32_stage9_sse2(__m128i *output,__m128i *x)

{
  undefined1 auVar1 [16];
  undefined1 (*in_RSI) [16];
  undefined1 (*in_RDI) [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  __m128i _in1_11;
  __m128i _in0_11;
  __m128i _in1_10;
  __m128i _in0_10;
  __m128i _in1_9;
  __m128i _in0_9;
  __m128i _in1_8;
  __m128i _in0_8;
  __m128i _in1_7;
  __m128i _in0_7;
  __m128i _in1_6;
  __m128i _in0_6;
  __m128i _in1_5;
  __m128i _in0_5;
  __m128i _in1_4;
  __m128i _in0_4;
  __m128i _in1_3;
  __m128i _in0_3;
  __m128i _in1_2;
  __m128i _in0_2;
  __m128i _in1_1;
  __m128i _in0_1;
  __m128i _in1;
  __m128i _in0;
  __m128i _in1_15;
  __m128i _in0_15;
  __m128i _in1_14;
  __m128i _in0_14;
  __m128i _in1_13;
  __m128i _in0_13;
  __m128i _in1_12;
  __m128i _in0_12;
  
  auVar3 = *in_RSI;
  auVar1 = in_RSI[0x1f];
  auVar2 = paddsw(*in_RSI,in_RSI[0x1f]);
  *in_RDI = auVar2;
  auVar3 = psubsw(auVar3,auVar1);
  in_RDI[0x1f] = auVar3;
  auVar3 = in_RSI[1];
  auVar1 = in_RSI[0x1e];
  auVar2 = paddsw(in_RSI[1],in_RSI[0x1e]);
  in_RDI[1] = auVar2;
  auVar3 = psubsw(auVar3,auVar1);
  in_RDI[0x1e] = auVar3;
  auVar3 = in_RSI[2];
  auVar1 = in_RSI[0x1d];
  auVar2 = paddsw(in_RSI[2],in_RSI[0x1d]);
  in_RDI[2] = auVar2;
  auVar3 = psubsw(auVar3,auVar1);
  in_RDI[0x1d] = auVar3;
  auVar3 = in_RSI[3];
  auVar1 = in_RSI[0x1c];
  auVar2 = paddsw(in_RSI[3],in_RSI[0x1c]);
  in_RDI[3] = auVar2;
  auVar3 = psubsw(auVar3,auVar1);
  in_RDI[0x1c] = auVar3;
  auVar3 = in_RSI[4];
  auVar1 = in_RSI[0x1b];
  auVar2 = paddsw(in_RSI[4],in_RSI[0x1b]);
  in_RDI[4] = auVar2;
  auVar3 = psubsw(auVar3,auVar1);
  in_RDI[0x1b] = auVar3;
  auVar3 = in_RSI[5];
  auVar1 = in_RSI[0x1a];
  auVar2 = paddsw(in_RSI[5],in_RSI[0x1a]);
  in_RDI[5] = auVar2;
  auVar3 = psubsw(auVar3,auVar1);
  in_RDI[0x1a] = auVar3;
  auVar3 = in_RSI[6];
  auVar1 = in_RSI[0x19];
  auVar2 = paddsw(in_RSI[6],in_RSI[0x19]);
  in_RDI[6] = auVar2;
  auVar3 = psubsw(auVar3,auVar1);
  in_RDI[0x19] = auVar3;
  auVar3 = in_RSI[7];
  auVar1 = in_RSI[0x18];
  auVar2 = paddsw(in_RSI[7],in_RSI[0x18]);
  in_RDI[7] = auVar2;
  auVar3 = psubsw(auVar3,auVar1);
  in_RDI[0x18] = auVar3;
  auVar3 = in_RSI[8];
  auVar1 = in_RSI[0x17];
  auVar2 = paddsw(in_RSI[8],in_RSI[0x17]);
  in_RDI[8] = auVar2;
  auVar3 = psubsw(auVar3,auVar1);
  in_RDI[0x17] = auVar3;
  auVar3 = in_RSI[9];
  auVar1 = in_RSI[0x16];
  auVar2 = paddsw(in_RSI[9],in_RSI[0x16]);
  in_RDI[9] = auVar2;
  auVar3 = psubsw(auVar3,auVar1);
  in_RDI[0x16] = auVar3;
  auVar3 = in_RSI[10];
  auVar1 = in_RSI[0x15];
  auVar2 = paddsw(in_RSI[10],in_RSI[0x15]);
  in_RDI[10] = auVar2;
  auVar3 = psubsw(auVar3,auVar1);
  in_RDI[0x15] = auVar3;
  auVar3 = in_RSI[0xb];
  auVar1 = in_RSI[0x14];
  auVar2 = paddsw(in_RSI[0xb],in_RSI[0x14]);
  in_RDI[0xb] = auVar2;
  auVar3 = psubsw(auVar3,auVar1);
  in_RDI[0x14] = auVar3;
  auVar3 = in_RSI[0xc];
  auVar1 = in_RSI[0x13];
  auVar2 = paddsw(in_RSI[0xc],in_RSI[0x13]);
  in_RDI[0xc] = auVar2;
  auVar3 = psubsw(auVar3,auVar1);
  in_RDI[0x13] = auVar3;
  auVar3 = in_RSI[0xd];
  auVar1 = in_RSI[0x12];
  auVar2 = paddsw(in_RSI[0xd],in_RSI[0x12]);
  in_RDI[0xd] = auVar2;
  auVar3 = psubsw(auVar3,auVar1);
  in_RDI[0x12] = auVar3;
  auVar3 = in_RSI[0xe];
  auVar1 = in_RSI[0x11];
  auVar2 = paddsw(in_RSI[0xe],in_RSI[0x11]);
  in_RDI[0xe] = auVar2;
  auVar3 = psubsw(auVar3,auVar1);
  in_RDI[0x11] = auVar3;
  auVar3 = in_RSI[0xf];
  auVar1 = in_RSI[0x10];
  auVar2 = paddsw(in_RSI[0xf],in_RSI[0x10]);
  in_RDI[0xf] = auVar2;
  auVar3 = psubsw(auVar3,auVar1);
  in_RDI[0x10] = auVar3;
  return;
}

Assistant:

static inline void idct32_stage9_sse2(__m128i *output, __m128i *x) {
  btf_16_adds_subs_out_sse2(output[0], output[31], x[0], x[31]);
  btf_16_adds_subs_out_sse2(output[1], output[30], x[1], x[30]);
  btf_16_adds_subs_out_sse2(output[2], output[29], x[2], x[29]);
  btf_16_adds_subs_out_sse2(output[3], output[28], x[3], x[28]);
  btf_16_adds_subs_out_sse2(output[4], output[27], x[4], x[27]);
  btf_16_adds_subs_out_sse2(output[5], output[26], x[5], x[26]);
  btf_16_adds_subs_out_sse2(output[6], output[25], x[6], x[25]);
  btf_16_adds_subs_out_sse2(output[7], output[24], x[7], x[24]);
  btf_16_adds_subs_out_sse2(output[8], output[23], x[8], x[23]);
  btf_16_adds_subs_out_sse2(output[9], output[22], x[9], x[22]);
  btf_16_adds_subs_out_sse2(output[10], output[21], x[10], x[21]);
  btf_16_adds_subs_out_sse2(output[11], output[20], x[11], x[20]);
  btf_16_adds_subs_out_sse2(output[12], output[19], x[12], x[19]);
  btf_16_adds_subs_out_sse2(output[13], output[18], x[13], x[18]);
  btf_16_adds_subs_out_sse2(output[14], output[17], x[14], x[17]);
  btf_16_adds_subs_out_sse2(output[15], output[16], x[15], x[16]);
}